

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::LessThan,duckdb::StandardLeastGreatest<true>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  Vector *this;
  data_ptr_t pdVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  VectorType vector_type_p;
  size_type sVar8;
  string_t *psVar9;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  anon_union_16_2_67f50693_for_value local_8a8;
  string_t *local_898;
  ExpressionState *local_890;
  Vector *local_888;
  UnifiedVectorFormat local_880;
  bool local_838 [2056];
  
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar5);
    return;
  }
  local_890 = state;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    vector_type_p = CONSTANT_VECTOR;
  }
  else {
    vector_type_p = CONSTANT_VECTOR;
    sVar8 = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar8);
      if (pvVar5->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar8);
      StringVector::AddHeapReference(result,pvVar5);
      sVar8 = sVar8 + 1;
    } while (sVar8 < (ulong)(((long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  local_898 = (string_t *)result->data;
  local_888 = result;
  switchD_005700f1::default(local_838,0,0x800);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar8 = 0;
    do {
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar8);
      if (pvVar5->vector_type == CONSTANT_VECTOR) {
        pvVar5 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar8);
        puVar2 = (pvVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) goto LAB_00fa5977;
      }
      else {
LAB_00fa5977:
        UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
        pvVar5 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar8);
        Vector::ToUnifiedFormat(pvVar5,args->count,&local_880);
        pdVar3 = local_880.data;
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (args->count != 0) {
            uVar7 = 0;
            psVar9 = local_898;
            do {
              uVar6 = uVar7;
              if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                uVar6 = (ulong)(local_880.sel)->sel_vector[uVar7];
              }
              pdVar1 = pdVar3 + uVar6 * 0x10;
              local_8a8._0_8_ = *(undefined8 *)pdVar1;
              local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
              if ((local_838[uVar7] != true) ||
                 (bVar4 = string_t::StringComparisonOperators::GreaterThan
                                    (psVar9,(string_t *)&local_8a8.pointer), bVar4)) {
                local_838[uVar7] = true;
                *(undefined8 *)&psVar9->value = local_8a8._0_8_;
                (psVar9->value).pointer.ptr = local_8a8.pointer.ptr;
              }
              uVar7 = uVar7 + 1;
              psVar9 = psVar9 + 1;
            } while (uVar7 < args->count);
          }
        }
        else if (args->count != 0) {
          uVar7 = 0;
          psVar9 = local_898;
          do {
            uVar6 = uVar7;
            if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
              uVar6 = (ulong)(local_880.sel)->sel_vector[uVar7];
            }
            if ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
              pdVar1 = pdVar3 + uVar6 * 0x10;
              local_8a8._0_8_ = *(undefined8 *)pdVar1;
              local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
              if ((local_838[uVar7] != true) ||
                 (bVar4 = string_t::StringComparisonOperators::GreaterThan
                                    (psVar9,(string_t *)&local_8a8.pointer), bVar4)) {
                local_838[uVar7] = true;
                *(undefined8 *)&psVar9->value = local_8a8._0_8_;
                (psVar9->value).pointer.ptr = local_8a8.pointer.ptr;
              }
            }
            uVar7 = uVar7 + 1;
            psVar9 = psVar9 + 1;
          } while (uVar7 < args->count);
        }
        if (local_880.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 < (ulong)(((long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  this = local_888;
  StandardLeastGreatest<true>::FinalizeResult(args->count,local_838,local_888,local_890);
  Vector::SetVectorType(this,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}